

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.hpp
# Opt level: O0

void __thiscall
Document::draw(Document *this,Path *path,Style *style,Transformation *transformation)

{
  Style *pSVar1;
  bool bVar2;
  undefined1 local_58 [48];
  Transformation *local_28;
  Transformation *transformation_local;
  Style *style_local;
  Path *path_local;
  Document *this_local;
  
  local_28 = transformation;
  transformation_local = (Transformation *)style;
  style_local = (Style *)path;
  path_local = (Path *)this;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)style);
  pSVar1 = style_local;
  if ((bVar2) && (0.0 < transformation_local->e)) {
    Style::get_fill_paint((Style *)(local_58 + 0x20),transformation_local);
    fill(this,(Path *)pSVar1,(shared_ptr<Paint> *)(local_58 + 0x20));
    std::shared_ptr<Paint>::~shared_ptr((shared_ptr<Paint> *)(local_58 + 0x20));
  }
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(transformation_local + 1));
  pSVar1 = style_local;
  if (((bVar2) && (0.0 < transformation_local[1].e)) && (0.0 < transformation_local[1].f)) {
    Style::get_stroke_paint((Style *)local_58,transformation_local);
    stroke(this,(Path *)pSVar1,(shared_ptr<Paint> *)local_58,transformation_local[1].e);
    std::shared_ptr<Paint>::~shared_ptr((shared_ptr<Paint> *)local_58);
  }
  return;
}

Assistant:

void draw(const Path& path, const Style& style, const Transformation& transformation = Transformation()) {
		if (style.fill && style.fill_opacity > 0.f) {
			fill(path, style.get_fill_paint(transformation));
		}
		if (style.stroke && style.stroke_width > 0.f && style.stroke_opacity > 0.f) {
			stroke(path, style.get_stroke_paint(transformation), style.stroke_width);
		}
	}